

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solver.cpp
# Opt level: O0

vec * construct_rhs(vec *__return_storage_ptr__,int nx,int nt,vec *previous_layer,double t,
                   function_2var f,function_2var u)

{
  int iVar1;
  size_type __n;
  const_reference pvVar2;
  reference pvVar3;
  double dVar4;
  double dVar5;
  int local_58;
  allocator<double> local_51;
  int i;
  undefined1 local_45;
  function_2var local_38;
  function_2var u_local;
  function_2var f_local;
  double t_local;
  vec *previous_layer_local;
  int nt_local;
  int nx_local;
  vec *rhs;
  
  local_38 = u;
  u_local = f;
  f_local = (function_2var)t;
  t_local = (double)previous_layer;
  previous_layer_local._0_4_ = nt;
  previous_layer_local._4_4_ = nx;
  _nt_local = __return_storage_ptr__;
  if ((construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
       ::size == '\0') &&
     (iVar1 = __cxa_guard_acquire(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                                   ::size), iVar1 != 0)) {
    construct_rhs::size = compute_linear_system_size(previous_layer_local._4_4_ + -1);
    __cxa_guard_release(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                         ::size);
  }
  local_45 = 0;
  __n = (size_type)construct_rhs::size;
  _i = 0.0;
  std::allocator<double>::allocator(&local_51);
  std::vector<double,_std::allocator<double>_>::vector
            (__return_storage_ptr__,__n,(value_type_conflict *)&i,&local_51);
  std::allocator<double>::~allocator(&local_51);
  if ((construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
       ::h == '\0') &&
     (iVar1 = __cxa_guard_acquire(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                                   ::h), iVar1 != 0)) {
    construct_rhs::h = 0.7853981633974483 / (double)previous_layer_local._4_4_;
    __cxa_guard_release(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                         ::h);
  }
  if ((construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
       ::tau == '\0') &&
     (iVar1 = __cxa_guard_acquire(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                                   ::tau), iVar1 != 0)) {
    construct_rhs::tau = 1.0 / (double)(int)previous_layer_local;
    __cxa_guard_release(&construct_rhs(int,int,std::vector<double,std::allocator<double>>const&,double,double(*)(double,double),double(*)(double,double))
                         ::tau);
  }
  for (local_58 = 0; local_58 < previous_layer_local._4_4_ + -1; local_58 = local_58 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)t_local,(long)local_58);
    dVar4 = -*pvVar2 / construct_rhs::tau;
    dVar5 = (*u_local)(construct_rhs::h * (double)(local_58 + 1),(double)f_local);
    pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                       (__return_storage_ptr__,(long)local_58);
    *pvVar3 = dVar4 - dVar5;
  }
  dVar4 = (*local_38)(0.0,(double)f_local);
  dVar4 = (dVar4 / construct_rhs::h) / construct_rhs::h;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](__return_storage_ptr__,0);
  *pvVar3 = *pvVar3 - dVar4;
  dVar4 = (*local_38)(0.7853981633974483,(double)f_local);
  dVar4 = (dVar4 / construct_rhs::h) / construct_rhs::h;
  pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                     (__return_storage_ptr__,(long)(previous_layer_local._4_4_ + -2));
  *pvVar3 = *pvVar3 - dVar4;
  return __return_storage_ptr__;
}

Assistant:

vec construct_rhs(int nx, int nt, const vec& previous_layer,
        double t, function_2var f, function_2var u)
{
    static int size = compute_linear_system_size(nx - 1);

    vec rhs(size, 0.0);

    static double h = X / nx;
    static double tau = T / nt;

    for (int i = 0; i < nx - 1; i++)
    {
        rhs[i] = -previous_layer[i] / tau - f(h * (i + 1), t);
    }

    rhs[0] -= u(0.0, t) / h / h;
    rhs[nx - 2] -= u(X, t) / h / h;

    return rhs;
}